

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

uint Js::FunctionBody::GetReducedLoopInterpretCount(void)

{
  bool bVar1;
  uint *puVar2;
  uint local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  uint loopInterpretCount;
  
  local_10 = DAT_01eace48;
  bVar1 = ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Configuration::Global,LoopInterpretCountFlag);
  if (bVar1) {
    local_c = local_10;
  }
  else {
    local_14 = local_10 / 3;
    local_18 = GetMinLoopProfileIterations(local_10);
    puVar2 = max<unsigned_int>(&local_14,&local_18);
    local_c = *puVar2;
  }
  return local_c;
}

Assistant:

uint FunctionBody::GetReducedLoopInterpretCount()
    {
        const uint loopInterpretCount = CONFIG_FLAG(LoopInterpretCount);
        if(CONFIG_ISENABLED(LoopInterpretCountFlag))
        {
            return loopInterpretCount;
        }
        return max(loopInterpretCount / 3, GetMinLoopProfileIterations(loopInterpretCount));
    }